

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>_>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>,_0,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>_>
           *dst,CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>
                *src)

{
  long lVar1;
  Index inner;
  long row;
  long lVar2;
  Index col;
  long col_00;
  
  lVar2 = (dst->m_matrix->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value;
  col_00 = 0;
  if (lVar2 < 1) {
    lVar2 = col_00;
  }
  lVar1 = (dst->m_matrix->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value;
  if (lVar1 < 1) {
    lVar1 = col_00;
  }
  for (; col_00 != lVar1; col_00 = col_00 + 1) {
    for (row = 0; lVar2 != row; row = row + 1) {
      SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>,Eigen::CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,2>,0,Eigen::Stride<0,0>>const,256>>
      ::
      copyCoeff<Eigen::CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,2>,0,Eigen::Stride<0,0>>const,256>>
                ((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>,Eigen::CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,2>,0,Eigen::Stride<0,0>>const,256>>
                  *)dst,row,col_00,
                 (DenseBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_256>_>
                  *)src);
    }
  }
  return;
}

Assistant:

static inline void run(Derived1 &dst, const Derived2 &src)
  {
    const Index innerSize = dst.innerSize();
    const Index outerSize = dst.outerSize();
    for(Index outer = 0; outer < outerSize; ++outer)
      for(Index inner = 0; inner < innerSize; ++inner)
        dst.copyCoeffByOuterInner(outer, inner, src);
  }